

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

int cvui::internal::trackbarValueToXPixel
              (TrackbarParams *theParams,Rect *theBounding,longdouble theValue)

{
  double dVar1;
  double dVar2;
  
  dVar2 = (double)((theValue - *(longdouble *)theParams) /
                  (*(longdouble *)(theParams + 0x10) - *(longdouble *)theParams));
  dVar1 = 1.0;
  if (dVar2 <= 1.0) {
    dVar1 = dVar2;
  }
  dVar2 = 0.0;
  if (0.0 <= dVar1) {
    dVar2 = dVar1;
  }
  return (int)ROUND(dVar2 * (double)(theBounding->width + -0x1c) + (double)theBounding->x + 14.0);
}

Assistant:

inline int trackbarValueToXPixel(const TrackbarParams & theParams, cv::Rect & theBounding, long double theValue)
	{
		long double aRatio = (theValue - theParams.min) / (theParams.max - theParams.min);
		aRatio = clamp01(aRatio);
		long double thePixelsX = (long double)theBounding.x + gTrackbarMarginX + aRatio * (long double)(theBounding.width - 2 * gTrackbarMarginX);
		return (int)thePixelsX;
	}